

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_PostScript.cxx
# Opt level: O3

void __thiscall
Fl_PostScript_Graphics_Driver::xyline
          (Fl_PostScript_Graphics_Driver *this,int x,int y,int x1,int y2,int x3)

{
  fwrite("GS\n",3,1,(FILE *)this->output);
  fwrite("BP\n",3,1,(FILE *)this->output);
  fprintf((FILE *)this->output,"%i %i MT\n",(ulong)(uint)x,(ulong)(uint)y);
  fprintf((FILE *)this->output,"%i %i LT\n",(ulong)(uint)x1,(ulong)(uint)y);
  fprintf((FILE *)this->output,"%i %i LT\n",(ulong)(uint)x1,(ulong)(uint)y2);
  fprintf((FILE *)this->output,"%i %i LT\n",(ulong)(uint)x3,(ulong)(uint)y2);
  fwrite("ELP\n",4,1,(FILE *)this->output);
  fwrite("GR\n",3,1,(FILE *)this->output);
  return;
}

Assistant:

void Fl_PostScript_Graphics_Driver::xyline(int x, int y, int x1, int y2, int x3){
  fprintf(output, "GS\n");
  fprintf(output,"BP\n");
  fprintf(output, "%i %i MT\n", x , y );
  fprintf(output, "%i %i LT\n", x1 , y );
  fprintf(output, "%i %i LT\n", x1 , y2);
  fprintf(output,"%i %i LT\n", x3 , y2);
  fprintf(output, "ELP\n");
  fprintf(output, "GR\n");
}